

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O2

btVector3 __thiscall
btCapsuleShape::localGetSupportingVertexWithoutMargin(btCapsuleShape *this,btVector3 *vec0)

{
  int iVar1;
  btScalar __x;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar2;
  float fVar3;
  float fVar4;
  btVector3 bVar5;
  btVector3 local_88;
  btScalar local_78 [2];
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  float local_28;
  float fStack_24;
  undefined8 uStack_20;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  local_88.m_floats._0_8_ = *(undefined8 *)vec0->m_floats;
  local_88.m_floats._8_8_ = *(undefined8 *)(vec0->m_floats + 2);
  __x = btVector3::length2(&local_88);
  if (0.0001 <= __x) {
    if (__x < 0.0) {
      fVar2 = sqrtf(__x);
    }
    else {
      fVar2 = SQRT(__x);
    }
    fVar2 = 1.0 / fVar2;
    local_68 = fVar2 * local_88.m_floats[0];
    fStack_64 = fVar2 * local_88.m_floats[1];
    fStack_60 = fVar2 * 0.0;
    fStack_5c = fVar2 * 0.0;
    local_88.m_floats._0_8_ = CONCAT44(fStack_64,local_68);
    fVar2 = fVar2 * local_88.m_floats[2];
    local_88.m_floats[2] = fVar2;
  }
  else {
    local_68 = 1.0;
    fStack_64 = 0.0;
    fStack_60 = 0.0;
    fStack_5c = 0.0;
    local_88.m_floats[0] = 1.0;
    local_88.m_floats[1] = 0.0;
    local_88.m_floats[2] = 0.0;
    local_88.m_floats[3] = 0.0;
    fVar2 = 0.0;
  }
  iVar1 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
  fVar4 = (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[(iVar1 + 2) % 3];
  local_48 = ZEXT416((uint)fVar4);
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  uStack_70 = 0;
  local_78[iVar1] = (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar1];
  local_58 = ZEXT416((uint)(fVar2 * fVar4 + (float)uStack_70));
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  local_18 = (float)local_48._0_4_;
  fStack_14 = (float)local_48._0_4_;
  fStack_10 = (float)local_48._0_4_;
  fStack_c = (float)local_48._0_4_;
  local_28 = (local_78[0] + local_68 * (float)local_48._0_4_) -
             extraout_XMM0_Da * local_88.m_floats[0];
  fStack_24 = (local_78[1] + fStack_64 * (float)local_48._0_4_) -
              extraout_XMM0_Da * local_88.m_floats[1];
  fVar2 = (float)local_58._0_4_ - extraout_XMM0_Da * local_88.m_floats[2];
  local_58._8_8_ = 0;
  local_58._0_4_ = local_88.m_floats[0];
  local_58._4_4_ = local_88.m_floats[1];
  fVar4 = local_88.m_floats[2] * fVar2 +
          local_88.m_floats[0] * local_28 + local_88.m_floats[1] * fStack_24;
  if (-1e+18 < fVar4) {
    uStack_20 = CONCAT44((fStack_5c * (float)local_48._0_4_ + 0.0) - extraout_XMM0_Da * 0.0,
                         (fStack_60 * (float)local_48._0_4_ + 0.0) - extraout_XMM0_Da * 0.0);
  }
  else {
    fVar2 = 0.0;
    local_28 = 0.0;
    fStack_24 = 0.0;
    uStack_20 = 0;
  }
  local_38 = ZEXT416((uint)fVar2);
  if (fVar4 <= -1e+18) {
    fVar4 = -1e+18;
  }
  _local_68 = CONCAT44(fStack_64,fVar4);
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  uStack_70 = 0;
  iVar1 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
  local_78[iVar1] = -(this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar1];
  local_48._0_4_ = (float)local_48._0_4_ * local_88.m_floats[2] + (float)uStack_70;
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  fVar2 = (local_78[0] + local_18 * (float)local_58._0_4_) -
          extraout_XMM0_Da_00 * local_88.m_floats[0];
  fVar4 = (local_78[1] + fStack_14 * (float)local_58._4_4_) -
          extraout_XMM0_Da_00 * local_88.m_floats[1];
  fVar3 = (float)local_48._0_4_ - extraout_XMM0_Da_00 * local_88.m_floats[2];
  if (local_68 <
      local_88.m_floats[2] * fVar3 + local_88.m_floats[0] * fVar2 + local_88.m_floats[1] * fVar4) {
    local_38._4_4_ = 0;
  }
  else {
    fVar2 = local_28;
    fVar4 = fStack_24;
    fVar3 = (float)local_38._0_4_;
  }
  bVar5.m_floats[1] = fVar4;
  bVar5.m_floats[0] = fVar2;
  bVar5.m_floats[3] = (btScalar)local_38._4_4_;
  bVar5.m_floats[2] = fVar3;
  return (btVector3)bVar5.m_floats;
}

Assistant:

btVector3	btCapsuleShape::localGetSupportingVertexWithoutMargin(const btVector3& vec0)const
{

	btVector3 supVec(0,0,0);

	btScalar maxDot(btScalar(-BT_LARGE_FLOAT));

	btVector3 vec = vec0;
	btScalar lenSqr = vec.length2();
	if (lenSqr < btScalar(0.0001))
	{
		vec.setValue(1,0,0);
	} else
	{
		btScalar rlen = btScalar(1.) / btSqrt(lenSqr );
		vec *= rlen;
	}

	btVector3 vtx;
	btScalar newDot;
	
	btScalar radius = getRadius();


	{
		btVector3 pos(0,0,0);
		pos[getUpAxis()] = getHalfHeight();

		vtx = pos +vec*(radius) - vec * getMargin();
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}
	{
		btVector3 pos(0,0,0);
		pos[getUpAxis()] = -getHalfHeight();

		vtx = pos +vec*(radius) - vec * getMargin();
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}

	return supVec;

}